

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O2

int Gia_ManAreListCountListUsed(Gia_ManAre_t *p,Gia_PtrAre_t Root)

{
  Gia_StaAre_t *pGVar1;
  Gia_StaAre_t *pS;
  int iVar2;
  
  pGVar1 = (Gia_StaAre_t *)*p->ppStas;
  iVar2 = 0;
  for (pS = (Gia_StaAre_t *)
            ((long)p->nSize * (ulong)((uint)Root & 0xfffff) * 4 +
            *(long *)((long)p->ppStas + (ulong)((uint)Root >> 0x11 & 0x3ff8))); pGVar1 != pS;
      pS = Gia_StaNext(p,pS)) {
    iVar2 = iVar2 - ((int)~(uint)pS->iPrev >> 0x1f);
  }
  return iVar2;
}

Assistant:

static inline int Gia_ManAreListCountListUsed( Gia_ManAre_t * p, Gia_PtrAre_t Root )
{
    Gia_StaAre_t * pCube;
    int Counter = 0;
    Gia_ManAreForEachCubeList( p, Gia_ManAreSta(p, Root), pCube )
        Counter += Gia_StaIsUsed(pCube);
    return Counter;
}